

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
::
emplace_decomposable<char_const*,std::piecewise_construct_t_const&,std::tuple<char_const*&&>,std::tuple<phmap::priv::Tracked<int>&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
          *this,char **key,size_t hashval,piecewise_construct_t *args,tuple<const_char_*&&> *args_1,
          tuple<phmap::priv::Tracked<int>_&&> *args_2)

{
  long lVar1;
  size_t i;
  bool bVar2;
  
  i = _find_key<char_const*>(this,key,hashval);
  bVar2 = i == 0xffffffffffffffff;
  if (bVar2) {
    i = raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
        ::prepare_insert((raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
                          *)this,hashval);
    emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const*&&>,std::tuple<phmap::priv::Tracked<int>&&>>
              (this,i,args,args_1,args_2);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 8 + lVar1);
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }